

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::times_x_inplace(ChebyshevExpansion *this)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  Index index;
  Scalar *pSVar4;
  double dVar5;
  double dVar6;
  long local_48;
  Index i_1;
  Index i;
  double ciold;
  double cim1old;
  double plus;
  double diff;
  Index N;
  ChebyshevExpansion *this_local;
  
  index = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
  local_48 = index + -1;
  dVar5 = (this->m_xmax - this->m_xmin) / 2.0;
  dVar6 = (this->m_xmax + this->m_xmin) / 2.0;
  ciold = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,index + 1);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,index);
  *pSVar4 = 0.0;
  if (1 < local_48) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    ciold = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    dVar2 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    *pSVar4 = dVar5 * dVar1 * 0.5 + dVar6 * dVar2;
  }
  if (2 < local_48) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    SVar3 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,2);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    dVar2 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    *pSVar4 = dVar5 * (dVar1 * 0.5 + ciold) + dVar6 * dVar2;
    ciold = SVar3;
  }
  for (i_1 = 2; i_1 <= index + -2; i_1 = i_1 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_1);
    SVar3 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_1 + 1);
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_1);
    dVar2 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,i_1);
    *pSVar4 = dVar5 * (ciold + dVar1) * 0.5 + dVar6 * dVar2;
    ciold = SVar3;
  }
  for (; local_48 <= index; local_48 = local_48 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,local_48)
    ;
    SVar3 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,local_48)
    ;
    dVar1 = *pSVar4;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,local_48)
    ;
    *pSVar4 = dVar5 * ciold * 0.5 + dVar6 * dVar1;
    ciold = SVar3;
  }
  return this;
}

Assistant:

ChebyshevExpansion& ChebyshevExpansion::times_x_inplace() {
        Eigen::Index N = m_c.size() - 1; // N is the order of A
        double diff = ((m_xmax - m_xmin) / 2.0), plus = (m_xmax + m_xmin) / 2.0;
        double cim1old = 0, ciold = 0;
        m_c.conservativeResize(N+2);
        m_c(N+1) = 0.0; // Fill the last entry with a zero
        if (N > 1) {
            // 0-th element
            cim1old = m_c(0); // store the current 0-th element in temporary variable
            m_c(0) = diff*(0.5*m_c(1)) + plus*m_c(0);
        }
        if (N > 2) {
            // 1-th element
            ciold = m_c(1); // store the current 1-th element in temporary variable
            m_c(1) = diff*(cim1old + 0.5*m_c(2)) + plus*m_c(1);
            cim1old = ciold;
        }
        for (Eigen::Index i = 2; i <= N-1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*(cim1old + m_c(i + 1)))+plus*m_c(i);
            cim1old = ciold;
        }
        for (Eigen::Index i = N; i <= N + 1; ++i) {
            ciold = m_c(i); // store the current i-th element in temporary variable
            m_c(i) = diff*(0.5*cim1old) + plus*m_c(i);
            cim1old = ciold;
        }
        return *this;
    }